

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O2

QModelIndexList * __thiscall
QListView::selectedIndexes(QModelIndexList *__return_storage_ptr__,QListView *this)

{
  QListViewPrivate *pQVar1;
  long lVar2;
  quintptr qVar3;
  int iVar4;
  bool bVar5;
  iterator aend;
  iterator iVar6;
  long lVar7;
  QModelIndex *pQVar8;
  QModelIndex *pQVar9;
  QModelIndex *pQVar10;
  long lVar11;
  const_iterator abegin;
  long in_FS_OFFSET;
  anon_class_16_2_fd512dd1_for__M_pred local_58;
  anon_class_16_2_fd512dd1_for__M_pred local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = *(QListViewPrivate **)
            &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
             field_0x8;
  bVar5 = QPointer::operator_cast_to_bool
                    ((QPointer *)&(pQVar1->super_QAbstractItemViewPrivate).selectionModel);
  if (!bVar5) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QModelIndex *)0x0;
      (__return_storage_ptr__->d).size = 0;
      return __return_storage_ptr__;
    }
    goto LAB_0051568b;
  }
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
  QItemSelectionModel::selectedIndexes();
  pQVar9 = (__return_storage_ptr__->d).ptr;
  lVar2 = (__return_storage_ptr__->d).size;
  lVar11 = lVar2 * 0x18;
  pQVar10 = pQVar9;
  local_58.this = this;
  local_58.d = pQVar1;
  local_48.this = this;
  local_48.d = pQVar1;
  for (lVar7 = lVar2 >> 2; pQVar8 = pQVar10, 0 < lVar7; lVar7 = lVar7 + -1) {
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10);
    if (bVar5) goto LAB_005155ae;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10 + 1);
    pQVar8 = pQVar10 + 1;
    if (bVar5) goto LAB_005155ae;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10 + 2);
    pQVar8 = pQVar10 + 2;
    if (bVar5) goto LAB_005155ae;
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10 + 3);
    pQVar8 = pQVar10 + 3;
    if (bVar5) goto LAB_005155ae;
    pQVar10 = pQVar10 + 4;
    lVar11 = lVar11 + -0x60;
  }
  lVar11 = lVar11 / 0x18;
  if (lVar11 == 1) {
LAB_0051566e:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10);
    pQVar8 = pQVar9 + lVar2;
    if (bVar5) {
      pQVar8 = pQVar10;
    }
  }
  else if (lVar11 == 2) {
LAB_00515587:
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
            ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar8);
    if (!bVar5) {
      pQVar10 = pQVar8 + 1;
      goto LAB_0051566e;
    }
  }
  else {
    pQVar8 = pQVar9 + lVar2;
    if ((lVar11 == 3) &&
       (bVar5 = __gnu_cxx::__ops::
                _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
                ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_48,pQVar10),
       pQVar8 = pQVar10, !bVar5)) {
      pQVar8 = pQVar10 + 1;
      goto LAB_00515587;
    }
  }
LAB_005155ae:
  if (((long)pQVar8 - (long)pQVar9) / 0x18 == (__return_storage_ptr__->d).size) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return __return_storage_ptr__;
    }
  }
  else {
    aend = QList<QModelIndex>::end(__return_storage_ptr__);
    iVar6 = QList<QModelIndex>::begin(__return_storage_ptr__);
    abegin.i = iVar6.i + ((long)pQVar8 - (long)pQVar9);
    pQVar9 = abegin.i;
    while (pQVar10 = pQVar9, pQVar9 = pQVar10 + 1, pQVar9 != aend.i) {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qlistview.cpp:1529:22)>
              ::anon_class_16_2_fd512dd1_for__M_pred::operator()(&local_58,pQVar9);
      if (!bVar5) {
        ((abegin.i)->m).ptr = pQVar10[1].m.ptr;
        iVar4 = pQVar9->c;
        qVar3 = pQVar10[1].i;
        (abegin.i)->r = pQVar9->r;
        (abegin.i)->c = iVar4;
        (abegin.i)->i = qVar3;
        abegin.i = abegin.i + 1;
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QList<QModelIndex>::erase(__return_storage_ptr__,abegin,(const_iterator)aend.i);
      return __return_storage_ptr__;
    }
  }
LAB_0051568b:
  __stack_chk_fail();
}

Assistant:

QModelIndexList QListView::selectedIndexes() const
{
    Q_D(const QListView);
    if (!d->selectionModel)
        return QModelIndexList();

    QModelIndexList viewSelected = d->selectionModel->selectedIndexes();
    auto ignorable = [this, d](const QModelIndex &index) {
        return index.column() != d->column || index.parent() != d->root || isIndexHidden(index);
    };
    viewSelected.removeIf(ignorable);
    return viewSelected;
}